

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

void __thiscall EOPlus::Context::SetState(Context *this,string *state,bool do_actions)

{
  Quest *pQVar1;
  int iVar2;
  const_iterator cVar3;
  runtime_error *this_00;
  string state_id;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  util::lowercase(&local_68,state);
  std::__cxx11::string::_M_assign((string *)&this->state_name);
  iVar2 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar2 != 0) goto LAB_001386e3;
  }
  this->state = (State *)0x0;
  this->finished = true;
LAB_001386e3:
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>_>_>
          ::find(&(this->quest->states)._M_t,&local_68);
  pQVar1 = this->quest;
  iVar2 = std::__cxx11::string::compare((char *)&local_68);
  if ((_Rb_tree_header *)cVar3._M_node == &(pQVar1->states)._M_t._M_impl.super__Rb_tree_header) {
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar2 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"Unknown quest state: ",&local_68);
        std::runtime_error::runtime_error(this_00,(string *)&local_48);
        *(undefined ***)this_00 = &PTR__runtime_error_001d1608;
        __cxa_throw(this_00,&Runtime_Error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    this->finished = iVar2 == 0;
    this->state = (State *)(cVar3._M_node + 2);
    (**this->_vptr_Context)(this,state,(State *)(cVar3._M_node + 2));
    if (do_actions) {
      DoActions(this);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Context::SetState(const std::string& state, bool do_actions)
	{
		std::string state_id = util::lowercase(state);

		this->state_name = state_id;

		if (state_id == "end" || state_id == "done")
		{
			this->state = 0;
			this->finished = true;
		}

		auto it = this->quest->states.find(state_id);

		if (it == this->quest->states.end())
		{
			if (state_id == "end" || state_id == "done")
				return;
			else
				throw Runtime_Error("Unknown quest state: " + state_id);
		}

		this->finished = (state_id == "end");
		this->state = &it->second;
		this->BeginState(state, *this->state);

		if (do_actions)
			this->DoActions();
	}